

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJs.cpp
# Opt level: O2

bool Js::AsmJSCompiler::CheckFunction(AsmJsModuleCompiler *m,ParseNodeFnc *fncNode)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  AsmJsFunc *pAVar4;
  bool bVar5;
  
  if ((fncNode->super_ParseNode).nop != knopFncDecl) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJs.cpp"
                                ,0x2ac,"(fncNode->nop == knopFncDecl)","fncNode->nop == knopFncDecl"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,ByteCodePhase);
  if (bVar2) {
    Output::Print(L"  Checking Asm function: %s\n",fncNode->funcInfo->name);
  }
  bVar5 = false;
  bVar2 = CheckFunctionHead(m,&fncNode->super_ParseNode,false);
  if (bVar2) {
    pAVar4 = AsmJsModuleCompiler::CreateNewFunctionEntry(m,fncNode);
    bVar5 = true;
    if (pAVar4 == (AsmJsFunc *)0x0) {
      bVar2 = AsmJsModuleCompiler::Fail
                        (m,&fncNode->super_ParseNode,L"      Error creating function entry");
      return bVar2;
    }
  }
  return bVar5;
}

Assistant:

bool AsmJSCompiler::CheckFunction( AsmJsModuleCompiler &m, ParseNodeFnc * fncNode )
    {
        Assert( fncNode->nop == knopFncDecl );

        if( PHASE_TRACE1( Js::ByteCodePhase ) )
        {
            Output::Print( _u("  Checking Asm function: %s\n"), fncNode->funcInfo->name);
        }

        if( !CheckFunctionHead( m, fncNode, false ) )
        {
            return false;
        }

        AsmJsFunc* func = m.CreateNewFunctionEntry(fncNode);
        if (!func)
        {
            return m.Fail(fncNode, _u("      Error creating function entry"));
        }
        return true;
    }